

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::internal::fwrite_fully(void *ptr,size_t size,size_t count,FILE *stream)

{
  size_t sVar1;
  basic_string_view<char> *this;
  FILE *in_RCX;
  ulong in_RDX;
  size_t in_RSI;
  void *in_RDI;
  int in_stack_0000000c;
  system_error *in_stack_00000010;
  string_view in_stack_00000018;
  size_t written;
  char *in_stack_ffffffffffffffa8;
  
  sVar1 = fwrite(in_RDI,in_RSI,in_RDX,in_RCX);
  if (sVar1 < in_RDX) {
    this = (basic_string_view<char> *)__cxa_allocate_exception(0x18);
    __errno_location();
    basic_string_view<char>::basic_string_view(this,in_stack_ffffffffffffffa8);
    system_error::system_error<>(in_stack_00000010,in_stack_0000000c,in_stack_00000018);
    __cxa_throw(this,&system_error::typeinfo,system_error::~system_error);
  }
  return;
}

Assistant:

FMT_FUNC void fwrite_fully(const void* ptr, size_t size, size_t count,
                           FILE* stream) {
  size_t written = std::fwrite(ptr, size, count, stream);
  if (written < count) FMT_THROW(system_error(errno, "cannot write to file"));
}